

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::emit_hlsl_entry_point(CompilerHLSL *this)

{
  int iVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRConstant *pSVar4;
  CompilerError *pCVar5;
  anon_class_24_3_7215ebb4 local_658;
  anon_class_16_2_1de67c4e local_640;
  string local_630;
  string local_610;
  string local_5f0;
  Parameter *local_5d0;
  Parameter *arg_1;
  Parameter *__end2;
  Parameter *__begin2;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range2;
  SPIRFunction *func_1;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  arglist;
  anon_class_16_2_46e5c3c4 local_480;
  bool local_469;
  undefined1 local_468 [7];
  bool legacy;
  char *local_448;
  char *local_440;
  char *entry_point_name;
  string z_expr;
  string y_expr;
  string x_expr;
  uint32_t local_3d0;
  uint32_t z;
  uint32_t y;
  uint32_t x;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  uint32_t local_230;
  uint32_t local_22c;
  undefined1 local_228 [8];
  Bitset flags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  uint32_t local_1a8;
  undefined1 local_1a1;
  SPIRType *pSStack_1a0;
  bool block;
  SPIRType *base_type;
  SPIRVariable *var;
  Parameter *arg;
  Parameter *__end3;
  Parameter *__begin3;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range3;
  SPIRFunction *func;
  SPIREntryPoint *execution;
  allocator local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  arguments;
  CompilerHLSL *this_local;
  
  arguments.stack_storage.aligned_char._248_8_ = this;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_128);
  if ((this->require_input & 1U) != 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_148,"SPIRV_Cross_Input stage_input",&local_149);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_128,&local_148);
    ::std::__cxx11::string::~string((string *)&local_148);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_149);
  }
  func = (SPIRFunction *)Compiler::get_entry_point((Compiler *)this);
  iVar1 = *(int *)(func->shadow_arguments).stack_storage.aligned_char;
  if (iVar1 == 4) {
    bVar2 = Bitset::get((Bitset *)((long)&func->arguments + 0x68),9);
    if (bVar2) {
      CompilerGLSL::statement<char_const(&)[20]>
                (&this->super_CompilerGLSL,(char (*) [20])"[earlydepthstencil]");
    }
  }
  else if ((iVar1 == 5) || (iVar1 - 0x14f4U < 2)) {
    if (*(int *)(func->shadow_arguments).stack_storage.aligned_char == 0x14f5) {
      bVar2 = Bitset::get((Bitset *)((long)&func->arguments + 0x68),0x14b2);
      if (bVar2) {
        CompilerGLSL::statement<char_const(&)[29]>
                  (&this->super_CompilerGLSL,(char (*) [29])"[outputtopology(\"triangle\")]");
      }
      else {
        bVar2 = Bitset::get((Bitset *)((func->arguments).stack_storage.aligned_char + 0x50),0x1495);
        if (bVar2) {
          CompilerGLSL::statement<char_const(&)[25]>
                    (&this->super_CompilerGLSL,(char (*) [25])"[outputtopology(\"line\")]");
        }
        else {
          bVar2 = Bitset::get((Bitset *)((func->arguments).stack_storage.aligned_char + 0x50),0x1b);
          if (bVar2) {
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar5,"Topology mode \"points\" is not supported in DirectX");
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
        }
      }
      uVar3 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)
                         &(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
      __range3 = (SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                 Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,uVar3);
      __begin3 = (Parameter *)&((SPIRFunction *)__range3)->arguments;
      __end3 = VectorView<spirv_cross::SPIRFunction::Parameter>::begin
                         ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin3);
      arg = VectorView<spirv_cross::SPIRFunction::Parameter>::end
                      ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin3);
      for (; __end3 != arg; __end3 = __end3 + 1) {
        var = (SPIRVariable *)__end3;
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end3->id);
        base_type = (SPIRType *)Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,uVar3);
        uVar3 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(base_type->super_IVariant).field_0xc);
        pSStack_1a0 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
        local_1a8 = (pSStack_1a0->super_IVariant).self.id;
        local_1a1 = Compiler::has_decoration((Compiler *)this,(ID)local_1a8,Block);
        if (base_type->basetype == 0x151a) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                    (&flags.higher._M_h._M_single_bucket,this,base_type);
          ::std::operator+(&local_1c8,"in payload ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &flags.higher._M_h._M_single_bucket);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_128,&local_1c8);
          ::std::__cxx11::string::~string((string *)&local_1c8);
          ::std::__cxx11::string::~string((string *)&flags.higher._M_h._M_single_bucket);
        }
        else if ((bool)local_1a1) {
          local_22c = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)&(base_type->super_IVariant).self);
          Compiler::get_buffer_block_flags
                    ((Bitset *)local_228,(Compiler *)this,(VariableID)local_22c);
          bVar2 = Bitset::get((Bitset *)local_228,0x1497);
          if (bVar2) {
LAB_003a4592:
            ::std::__cxx11::to_string
                      (&local_290,*(uint *)((long)&(func->shadow_arguments).buffer_capacity + 4));
            ::std::operator+(&local_270,
                             "out primitives gl_MeshPerPrimitiveEXT gl_MeshPrimitivesEXT[",
                             &local_290);
            ::std::operator+(&local_250,&local_270,"]");
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)local_128,&local_250);
            ::std::__cxx11::string::~string((string *)&local_250);
            ::std::__cxx11::string::~string((string *)&local_270);
            ::std::__cxx11::string::~string((string *)&local_290);
          }
          else {
            local_230 = *(uint32_t *)((long)&(var->super_IVariant)._vptr_IVariant + 4);
            bVar2 = Compiler::has_decoration
                              ((Compiler *)this,(ID)local_230,DecorationPerPrimitiveEXT);
            if (bVar2) goto LAB_003a4592;
            ::std::__cxx11::to_string(&local_2f0,(uint)(func->shadow_arguments).buffer_capacity);
            ::std::operator+(&local_2d0,"out vertices gl_MeshPerVertexEXT gl_MeshVerticesEXT[",
                             &local_2f0);
            ::std::operator+(&local_2b0,&local_2d0,"]");
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)local_128,&local_2b0);
            ::std::__cxx11::string::~string((string *)&local_2b0);
            ::std::__cxx11::string::~string((string *)&local_2d0);
            ::std::__cxx11::string::~string((string *)&local_2f0);
          }
          Bitset::~Bitset((Bitset *)local_228);
        }
        else {
          bVar2 = Bitset::get((Bitset *)((func->arguments).stack_storage.aligned_char + 0x50),0x14b2
                             );
          if (bVar2) {
            ::std::__cxx11::to_string
                      (&local_350,*(uint *)((long)&(func->shadow_arguments).buffer_capacity + 4));
            ::std::operator+(&local_330,"out indices uint3 gl_PrimitiveTriangleIndicesEXT[",
                             &local_350);
            ::std::operator+(&local_310,&local_330,"]");
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)local_128,&local_310);
            ::std::__cxx11::string::~string((string *)&local_310);
            ::std::__cxx11::string::~string((string *)&local_330);
            ::std::__cxx11::string::~string((string *)&local_350);
          }
          else {
            ::std::__cxx11::to_string
                      ((string *)&wg_x,
                       *(uint *)((long)&(func->shadow_arguments).buffer_capacity + 4));
            ::std::operator+(&local_390,"out indices uint2 gl_PrimitiveLineIndicesEXT[",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &wg_x);
            ::std::operator+(&local_370,&local_390,"]");
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)local_128,&local_370);
            ::std::__cxx11::string::~string((string *)&local_370);
            ::std::__cxx11::string::~string((string *)&local_390);
            ::std::__cxx11::string::~string((string *)&wg_x);
          }
        }
      }
    }
    SpecializationConstant::SpecializationConstant(&wg_y);
    SpecializationConstant::SpecializationConstant(&wg_z);
    SpecializationConstant::SpecializationConstant((SpecializationConstant *)&y);
    Compiler::get_work_group_size_specialization_constants
              ((Compiler *)this,&wg_y,&wg_z,(SpecializationConstant *)&y);
    z = *(uint32_t *)((func->arguments).stack_storage.aligned_char + 0x90);
    local_3d0 = *(uint32_t *)((func->arguments).stack_storage.aligned_char + 0x94);
    x_expr.field_2._12_4_ = *(undefined4 *)((func->arguments).stack_storage.aligned_char + 0x98);
    if (((int)(func->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
              buffer_size == 0) &&
       (bVar2 = Bitset::get((Bitset *)((func->arguments).stack_storage.aligned_char + 0x50),0x26),
       bVar2)) {
      if (*(int *)((func->arguments).stack_storage.aligned_char + 0x9c) != 0) {
        pSVar4 = Compiler::get<spirv_cross::SPIRConstant>
                           ((Compiler *)this,
                            *(uint32_t *)((func->arguments).stack_storage.aligned_char + 0x9c));
        z = SPIRConstant::scalar(pSVar4,0,0);
      }
      if (*(int *)&(func->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                   ptr != 0) {
        pSVar4 = Compiler::get<spirv_cross::SPIRConstant>
                           ((Compiler *)this,
                            *(uint32_t *)
                             &(func->shadow_arguments).
                              super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr);
        local_3d0 = SPIRConstant::scalar(pSVar4,0,0);
      }
      if (*(int *)((long)&(func->shadow_arguments).
                          super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr + 4) != 0) {
        pSVar4 = Compiler::get<spirv_cross::SPIRConstant>
                           ((Compiler *)this,
                            *(uint32_t *)
                             ((long)&(func->shadow_arguments).
                                     super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr + 4)
                           );
        x_expr.field_2._12_4_ = SPIRConstant::scalar(pSVar4,0,0);
      }
    }
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&wg_y);
    if (uVar3 == 0) {
      ::std::__cxx11::to_string((string *)((long)&y_expr.field_2 + 8),z);
    }
    else {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&wg_y);
      pSVar4 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,uVar3);
      ::std::__cxx11::string::string
                ((string *)(y_expr.field_2._M_local_buf + 8),
                 (string *)&pSVar4->specialization_constant_macro_name);
    }
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&wg_z);
    if (uVar3 == 0) {
      ::std::__cxx11::to_string((string *)((long)&z_expr.field_2 + 8),local_3d0);
    }
    else {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&wg_z);
      pSVar4 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,uVar3);
      ::std::__cxx11::string::string
                ((string *)(z_expr.field_2._M_local_buf + 8),
                 (string *)&pSVar4->specialization_constant_macro_name);
    }
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&y);
    if (uVar3 == 0) {
      ::std::__cxx11::to_string((string *)&entry_point_name,x_expr.field_2._12_4_);
    }
    else {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&y);
      pSVar4 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,uVar3);
      ::std::__cxx11::string::string
                ((string *)&entry_point_name,(string *)&pSVar4->specialization_constant_macro_name);
    }
    CompilerGLSL::
    statement<char_const(&)[13],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [13])"[numthreads(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&y_expr.field_2 + 8),(char (*) [3])0x6737c9,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&z_expr.field_2 + 8),(char (*) [3])0x6737c9,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &entry_point_name,(char (*) [3])0x6629fc);
    ::std::__cxx11::string::~string((string *)&entry_point_name);
    ::std::__cxx11::string::~string((string *)(z_expr.field_2._M_local_buf + 8));
    ::std::__cxx11::string::~string((string *)(y_expr.field_2._M_local_buf + 8));
  }
  if (((this->hlsl_options).use_entry_point_name & 1U) == 0) {
    local_440 = "main";
  }
  else {
    Compiler::get_entry_point((Compiler *)this);
    local_440 = (char *)::std::__cxx11::string::c_str();
  }
  local_448 = "void ";
  if ((this->require_output & 1U) != 0) {
    local_448 = "SPIRV_Cross_Output ";
  }
  merge((string *)local_468,
        (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
         *)local_128,", ");
  CompilerGLSL::
  statement<char_const*,char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
            (&this->super_CompilerGLSL,&local_448,&local_440,(char (*) [2])0x676d60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468,
             (char (*) [2])0x682405);
  ::std::__cxx11::string::~string((string *)local_468);
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  local_469 = (this->hlsl_options).shader_model < 0x1f;
  local_480.legacy = &local_469;
  local_480.this = this;
  Bitset::for_each_bit<spirv_cross::CompilerHLSL::emit_hlsl_entry_point()::__0>
            (&(this->super_CompilerGLSL).super_Compiler.active_input_builtins,&local_480);
  arglist.stack_storage.aligned_char._248_8_ = this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerHLSL::emit_hlsl_entry_point()::__1>
            (&(this->super_CompilerGLSL).super_Compiler.ir,
             (anon_class_16_2_24649f85 *)(arglist.stack_storage.aligned_char + 0xf8));
  if ((((*(int *)(func->shadow_arguments).stack_storage.aligned_char != 0) &&
       (*(int *)(func->shadow_arguments).stack_storage.aligned_char != 4)) &&
      (*(int *)(func->shadow_arguments).stack_storage.aligned_char != 5)) &&
     ((*(int *)(func->shadow_arguments).stack_storage.aligned_char != 0x14f5 &&
      (*(int *)(func->shadow_arguments).stack_storage.aligned_char != 0x14f4)))) {
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar5,"Unsupported shader stage.");
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)&func_1);
  uVar3 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  __range2 = (SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
             Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,uVar3);
  __begin2 = (Parameter *)&((SPIRFunction *)__range2)->arguments;
  __end2 = VectorView<spirv_cross::SPIRFunction::Parameter>::begin
                     ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin2);
  arg_1 = VectorView<spirv_cross::SPIRFunction::Parameter>::end
                    ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin2);
  for (; __end2 != arg_1; __end2 = __end2 + 1) {
    local_5d0 = __end2;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end2->id);
    CompilerGLSL::to_expression_abi_cxx11_(&local_5f0,&this->super_CompilerGLSL,uVar3,false);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)&func_1,&local_5f0);
    ::std::__cxx11::string::~string((string *)&local_5f0);
  }
  get_inner_entry_point_name_abi_cxx11_(&local_610,this);
  merge(&local_630,
        (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
         *)&func_1,", ");
  CompilerGLSL::
  statement<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3]>
            (&this->super_CompilerGLSL,&local_610,(char (*) [2])0x676d60,&local_630,
             (char (*) [3])0x6815da);
  ::std::__cxx11::string::~string((string *)&local_630);
  ::std::__cxx11::string::~string((string *)&local_610);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)&func_1);
  if ((this->require_output & 1U) != 0) {
    CompilerGLSL::statement<char_const(&)[33]>
              (&this->super_CompilerGLSL,(char (*) [33])"SPIRV_Cross_Output stage_output;");
    local_640.legacy = &local_469;
    local_640.this = this;
    Bitset::for_each_bit<spirv_cross::CompilerHLSL::emit_hlsl_entry_point()::__2>
              (&(this->super_CompilerGLSL).super_Compiler.active_output_builtins,&local_640);
    local_658.legacy = &local_469;
    local_658.execution = (SPIREntryPoint *)func;
    local_658.this = this;
    ParsedIR::
    for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerHLSL::emit_hlsl_entry_point()::__3>
              (&(this->super_CompilerGLSL).super_Compiler.ir,&local_658);
    CompilerGLSL::statement<char_const(&)[21]>
              (&this->super_CompilerGLSL,(char (*) [21])"return stage_output;");
  }
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)local_128);
  return;
}

Assistant:

void CompilerHLSL::emit_hlsl_entry_point()
{
	SmallVector<string> arguments;

	if (require_input)
		arguments.push_back("SPIRV_Cross_Input stage_input");

	auto &execution = get_entry_point();

	switch (execution.model)
	{
	case ExecutionModelTaskEXT:
	case ExecutionModelMeshEXT:
	case ExecutionModelGLCompute:
	{
		if (execution.model == ExecutionModelMeshEXT)
		{
			if (execution.flags.get(ExecutionModeOutputTrianglesEXT))
				statement("[outputtopology(\"triangle\")]");
			else if (execution.flags.get(ExecutionModeOutputLinesEXT))
				statement("[outputtopology(\"line\")]");
			else if (execution.flags.get(ExecutionModeOutputPoints))
				SPIRV_CROSS_THROW("Topology mode \"points\" is not supported in DirectX");

			auto &func = get<SPIRFunction>(ir.default_entry_point);
			for (auto &arg : func.arguments)
			{
				auto &var = get<SPIRVariable>(arg.id);
				auto &base_type = get<SPIRType>(var.basetype);
				bool block = has_decoration(base_type.self, DecorationBlock);
				if (var.storage == StorageClassTaskPayloadWorkgroupEXT)
				{
					arguments.push_back("in payload " + variable_decl(var));
				}
				else if (block)
				{
					auto flags = get_buffer_block_flags(var.self);
					if (flags.get(DecorationPerPrimitiveEXT) || has_decoration(arg.id, DecorationPerPrimitiveEXT))
					{
						arguments.push_back("out primitives gl_MeshPerPrimitiveEXT gl_MeshPrimitivesEXT[" +
						                    std::to_string(execution.output_primitives) + "]");
					}
					else
					{
						arguments.push_back("out vertices gl_MeshPerVertexEXT gl_MeshVerticesEXT[" +
						                    std::to_string(execution.output_vertices) + "]");
					}
				}
				else
				{
					if (execution.flags.get(ExecutionModeOutputTrianglesEXT))
					{
						arguments.push_back("out indices uint3 gl_PrimitiveTriangleIndicesEXT[" +
						                    std::to_string(execution.output_primitives) + "]");
					}
					else
					{
						arguments.push_back("out indices uint2 gl_PrimitiveLineIndicesEXT[" +
						                    std::to_string(execution.output_primitives) + "]");
					}
				}
			}
		}
		SpecializationConstant wg_x, wg_y, wg_z;
		get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

		uint32_t x = execution.workgroup_size.x;
		uint32_t y = execution.workgroup_size.y;
		uint32_t z = execution.workgroup_size.z;

		if (!execution.workgroup_size.constant && execution.flags.get(ExecutionModeLocalSizeId))
		{
			if (execution.workgroup_size.id_x)
				x = get<SPIRConstant>(execution.workgroup_size.id_x).scalar();
			if (execution.workgroup_size.id_y)
				y = get<SPIRConstant>(execution.workgroup_size.id_y).scalar();
			if (execution.workgroup_size.id_z)
				z = get<SPIRConstant>(execution.workgroup_size.id_z).scalar();
		}

		auto x_expr = wg_x.id ? get<SPIRConstant>(wg_x.id).specialization_constant_macro_name : to_string(x);
		auto y_expr = wg_y.id ? get<SPIRConstant>(wg_y.id).specialization_constant_macro_name : to_string(y);
		auto z_expr = wg_z.id ? get<SPIRConstant>(wg_z.id).specialization_constant_macro_name : to_string(z);

		statement("[numthreads(", x_expr, ", ", y_expr, ", ", z_expr, ")]");
		break;
	}
	case ExecutionModelFragment:
		if (execution.flags.get(ExecutionModeEarlyFragmentTests))
			statement("[earlydepthstencil]");
		break;
	default:
		break;
	}

	const char *entry_point_name;
	if (hlsl_options.use_entry_point_name)
		entry_point_name = get_entry_point().name.c_str();
	else
		entry_point_name = "main";

	statement(require_output ? "SPIRV_Cross_Output " : "void ", entry_point_name, "(", merge(arguments), ")");
	begin_scope();
	bool legacy = hlsl_options.shader_model <= 30;

	// Copy builtins from entry point arguments to globals.
	active_input_builtins.for_each_bit([&](uint32_t i) {
		auto builtin = builtin_to_glsl(static_cast<BuiltIn>(i), StorageClassInput);
		switch (static_cast<BuiltIn>(i))
		{
		case BuiltInFragCoord:
			// VPOS in D3D9 is sampled at integer locations, apply half-pixel offset to be consistent.
			// TODO: Do we need an option here? Any reason why a D3D9 shader would be used
			// on a D3D10+ system with a different rasterization config?
			if (legacy)
				statement(builtin, " = stage_input.", builtin, " + float4(0.5f, 0.5f, 0.0f, 0.0f);");
			else
			{
				statement(builtin, " = stage_input.", builtin, ";");
				// ZW are undefined in D3D9, only do this fixup here.
				statement(builtin, ".w = 1.0 / ", builtin, ".w;");
			}
			break;

		case BuiltInVertexId:
		case BuiltInVertexIndex:
		case BuiltInInstanceIndex:
			// D3D semantics are uint, but shader wants int.
			if (hlsl_options.support_nonzero_base_vertex_base_instance || hlsl_options.shader_model >= 68)
			{
				if (hlsl_options.shader_model >= 68)
				{
					if (static_cast<BuiltIn>(i) == BuiltInInstanceIndex)
						statement(builtin, " = int(stage_input.", builtin, " + stage_input.gl_BaseInstanceARB);");
					else
						statement(builtin, " = int(stage_input.", builtin, " + stage_input.gl_BaseVertexARB);");
				}
				else
				{
					if (static_cast<BuiltIn>(i) == BuiltInInstanceIndex)
						statement(builtin, " = int(stage_input.", builtin, ") + SPIRV_Cross_BaseInstance;");
					else
						statement(builtin, " = int(stage_input.", builtin, ") + SPIRV_Cross_BaseVertex;");
				}
			}
			else
				statement(builtin, " = int(stage_input.", builtin, ");");
			break;

		case BuiltInBaseVertex:
			if (hlsl_options.shader_model >= 68)
				statement(builtin, " = stage_input.gl_BaseVertexARB;");
			else
				statement(builtin, " = SPIRV_Cross_BaseVertex;");
			break;

		case BuiltInBaseInstance:
			if (hlsl_options.shader_model >= 68)
				statement(builtin, " = stage_input.gl_BaseInstanceARB;");
			else
				statement(builtin, " = SPIRV_Cross_BaseInstance;");
			break;

		case BuiltInInstanceId:
			// D3D semantics are uint, but shader wants int.
			statement(builtin, " = int(stage_input.", builtin, ");");
			break;

		case BuiltInSampleMask:
			statement(builtin, "[0] = stage_input.", builtin, ";");
			break;

		case BuiltInNumWorkgroups:
		case BuiltInPointCoord:
		case BuiltInSubgroupSize:
		case BuiltInSubgroupLocalInvocationId:
		case BuiltInHelperInvocation:
			break;

		case BuiltInSubgroupEqMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("gl_SubgroupEqMask = 1u << (WaveGetLaneIndex() - uint4(0, 32, 64, 96));");
			statement("if (WaveGetLaneIndex() >= 32) gl_SubgroupEqMask.x = 0;");
			statement("if (WaveGetLaneIndex() >= 64 || WaveGetLaneIndex() < 32) gl_SubgroupEqMask.y = 0;");
			statement("if (WaveGetLaneIndex() >= 96 || WaveGetLaneIndex() < 64) gl_SubgroupEqMask.z = 0;");
			statement("if (WaveGetLaneIndex() < 96) gl_SubgroupEqMask.w = 0;");
			break;

		case BuiltInSubgroupGeMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("gl_SubgroupGeMask = ~((1u << (WaveGetLaneIndex() - uint4(0, 32, 64, 96))) - 1u);");
			statement("if (WaveGetLaneIndex() >= 32) gl_SubgroupGeMask.x = 0u;");
			statement("if (WaveGetLaneIndex() >= 64) gl_SubgroupGeMask.y = 0u;");
			statement("if (WaveGetLaneIndex() >= 96) gl_SubgroupGeMask.z = 0u;");
			statement("if (WaveGetLaneIndex() < 32) gl_SubgroupGeMask.y = ~0u;");
			statement("if (WaveGetLaneIndex() < 64) gl_SubgroupGeMask.z = ~0u;");
			statement("if (WaveGetLaneIndex() < 96) gl_SubgroupGeMask.w = ~0u;");
			break;

		case BuiltInSubgroupGtMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("uint gt_lane_index = WaveGetLaneIndex() + 1;");
			statement("gl_SubgroupGtMask = ~((1u << (gt_lane_index - uint4(0, 32, 64, 96))) - 1u);");
			statement("if (gt_lane_index >= 32) gl_SubgroupGtMask.x = 0u;");
			statement("if (gt_lane_index >= 64) gl_SubgroupGtMask.y = 0u;");
			statement("if (gt_lane_index >= 96) gl_SubgroupGtMask.z = 0u;");
			statement("if (gt_lane_index >= 128) gl_SubgroupGtMask.w = 0u;");
			statement("if (gt_lane_index < 32) gl_SubgroupGtMask.y = ~0u;");
			statement("if (gt_lane_index < 64) gl_SubgroupGtMask.z = ~0u;");
			statement("if (gt_lane_index < 96) gl_SubgroupGtMask.w = ~0u;");
			break;

		case BuiltInSubgroupLeMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("uint le_lane_index = WaveGetLaneIndex() + 1;");
			statement("gl_SubgroupLeMask = (1u << (le_lane_index - uint4(0, 32, 64, 96))) - 1u;");
			statement("if (le_lane_index >= 32) gl_SubgroupLeMask.x = ~0u;");
			statement("if (le_lane_index >= 64) gl_SubgroupLeMask.y = ~0u;");
			statement("if (le_lane_index >= 96) gl_SubgroupLeMask.z = ~0u;");
			statement("if (le_lane_index >= 128) gl_SubgroupLeMask.w = ~0u;");
			statement("if (le_lane_index < 32) gl_SubgroupLeMask.y = 0u;");
			statement("if (le_lane_index < 64) gl_SubgroupLeMask.z = 0u;");
			statement("if (le_lane_index < 96) gl_SubgroupLeMask.w = 0u;");
			break;

		case BuiltInSubgroupLtMask:
			// Emulate these ...
			// No 64-bit in HLSL, so have to do it in 32-bit and unroll.
			statement("gl_SubgroupLtMask = (1u << (WaveGetLaneIndex() - uint4(0, 32, 64, 96))) - 1u;");
			statement("if (WaveGetLaneIndex() >= 32) gl_SubgroupLtMask.x = ~0u;");
			statement("if (WaveGetLaneIndex() >= 64) gl_SubgroupLtMask.y = ~0u;");
			statement("if (WaveGetLaneIndex() >= 96) gl_SubgroupLtMask.z = ~0u;");
			statement("if (WaveGetLaneIndex() < 32) gl_SubgroupLtMask.y = 0u;");
			statement("if (WaveGetLaneIndex() < 64) gl_SubgroupLtMask.z = 0u;");
			statement("if (WaveGetLaneIndex() < 96) gl_SubgroupLtMask.w = 0u;");
			break;

		case BuiltInClipDistance:
			for (uint32_t clip = 0; clip < clip_distance_count; clip++)
				statement("gl_ClipDistance[", clip, "] = stage_input.gl_ClipDistance", clip / 4, ".", "xyzw"[clip & 3],
				          ";");
			break;

		case BuiltInCullDistance:
			for (uint32_t cull = 0; cull < cull_distance_count; cull++)
				statement("gl_CullDistance[", cull, "] = stage_input.gl_CullDistance", cull / 4, ".", "xyzw"[cull & 3],
				          ";");
			break;

		default:
			statement(builtin, " = stage_input.", builtin, ";");
			break;
		}
	});

	// Copy from stage input struct to globals.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);

		if (var.storage != StorageClassInput)
			return;

		bool need_matrix_unroll = var.storage == StorageClassInput && execution.model == ExecutionModelVertex;

		if (!var.remapped_variable && type.pointer && !is_builtin_variable(var) &&
		    interface_variable_exists_in_entry_point(var.self))
		{
			if (block)
			{
				auto type_name = to_name(type.self);
				auto var_name = to_name(var.self);
				for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(type.member_types.size()); mbr_idx++)
				{
					auto mbr_name = to_member_name(type, mbr_idx);
					auto flat_name = join(type_name, "_", mbr_name);
					statement(var_name, ".", mbr_name, " = stage_input.", flat_name, ";");
				}
			}
			else
			{
				auto name = to_name(var.self);
				auto &mtype = this->get<SPIRType>(var.basetype);
				if (need_matrix_unroll && mtype.columns > 1)
				{
					// Unroll matrices.
					for (uint32_t col = 0; col < mtype.columns; col++)
						statement(name, "[", col, "] = stage_input.", name, "_", col, ";");
				}
				else
				{
					statement(name, " = stage_input.", name, ";");
				}
			}
		}
	});

	// Run the shader.
	if (execution.model == ExecutionModelVertex ||
	    execution.model == ExecutionModelFragment ||
	    execution.model == ExecutionModelGLCompute ||
	    execution.model == ExecutionModelMeshEXT ||
	    execution.model == ExecutionModelTaskEXT)
	{
		// For mesh shaders, we receive special arguments that we must pass down as function arguments.
		// HLSL does not support proper reference types for passing these IO blocks,
		// but DXC post-inlining seems to magically fix it up anyways *shrug*.
		SmallVector<string> arglist;
		auto &func = get<SPIRFunction>(ir.default_entry_point);
		// The arguments are marked out, avoid detecting reads and emitting inout.
		for (auto &arg : func.arguments)
			arglist.push_back(to_expression(arg.id, false));
		statement(get_inner_entry_point_name(), "(", merge(arglist), ");");
	}
	else
		SPIRV_CROSS_THROW("Unsupported shader stage.");

	// Copy stage outputs.
	if (require_output)
	{
		statement("SPIRV_Cross_Output stage_output;");

		// Copy builtins from globals to return struct.
		active_output_builtins.for_each_bit([&](uint32_t i) {
			// PointSize doesn't exist in HLSL SM 4+.
			if (i == BuiltInPointSize && !legacy)
				return;

			switch (static_cast<BuiltIn>(i))
			{
			case BuiltInClipDistance:
				for (uint32_t clip = 0; clip < clip_distance_count; clip++)
					statement("stage_output.gl_ClipDistance", clip / 4, ".", "xyzw"[clip & 3], " = gl_ClipDistance[",
					          clip, "];");
				break;

			case BuiltInCullDistance:
				for (uint32_t cull = 0; cull < cull_distance_count; cull++)
					statement("stage_output.gl_CullDistance", cull / 4, ".", "xyzw"[cull & 3], " = gl_CullDistance[",
					          cull, "];");
				break;

			case BuiltInSampleMask:
				statement("stage_output.gl_SampleMask = gl_SampleMask[0];");
				break;

			default:
			{
				auto builtin_expr = builtin_to_glsl(static_cast<BuiltIn>(i), StorageClassOutput);
				statement("stage_output.", builtin_expr, " = ", builtin_expr, ";");
				break;
			}
			}
		});

		ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
			auto &type = this->get<SPIRType>(var.basetype);
			bool block = has_decoration(type.self, DecorationBlock);

			if (var.storage != StorageClassOutput)
				return;

			if (!var.remapped_variable && type.pointer &&
			    !is_builtin_variable(var) &&
			    interface_variable_exists_in_entry_point(var.self))
			{
				if (block)
				{
					// I/O blocks need to flatten output.
					auto type_name = to_name(type.self);
					auto var_name = to_name(var.self);
					for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(type.member_types.size()); mbr_idx++)
					{
						auto mbr_name = to_member_name(type, mbr_idx);
						auto flat_name = join(type_name, "_", mbr_name);
						statement("stage_output.", flat_name, " = ", var_name, ".", mbr_name, ";");
					}
				}
				else
				{
					auto name = to_name(var.self);

					if (legacy && execution.model == ExecutionModelFragment)
					{
						string output_filler;
						for (uint32_t size = type.vecsize; size < 4; ++size)
							output_filler += ", 0.0";

						statement("stage_output.", name, " = float4(", name, output_filler, ");");
					}
					else
					{
						statement("stage_output.", name, " = ", name, ";");
					}
				}
			}
		});

		statement("return stage_output;");
	}

	end_scope();
}